

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyContainer.hh
# Opt level: O1

BasePropHandleT<short> __thiscall
OpenMesh::PropertyContainer::handle<short>(PropertyContainer *this,short *param_1,string *_name)

{
  pointer ppBVar1;
  pointer __s2;
  size_t sVar2;
  BaseProperty *pBVar3;
  size_t __n;
  int iVar4;
  long lVar5;
  int iVar6;
  pointer ppBVar7;
  
  ppBVar7 = (this->properties_).
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppBVar1 = (this->properties_).
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar7 != ppBVar1) {
    __s2 = (_name->_M_dataplus)._M_p;
    sVar2 = _name->_M_string_length;
    iVar6 = 0;
    do {
      pBVar3 = *ppBVar7;
      if ((((pBVar3 != (BaseProperty *)0x0) &&
           (__n = (pBVar3->name_)._M_string_length, __n == sVar2)) &&
          ((__n == 0 || (iVar4 = bcmp((pBVar3->name_)._M_dataplus._M_p,__s2,__n), iVar4 == 0)))) &&
         ((*ppBVar7 != (BaseProperty *)0x0 &&
          (lVar5 = __dynamic_cast(*ppBVar7,&BaseProperty::typeinfo,&PropertyT<short>::typeinfo,0),
          lVar5 != 0)))) {
        return (BasePropHandleT<short>)(BaseHandle)iVar6;
      }
      ppBVar7 = ppBVar7 + 1;
      iVar6 = iVar6 + 1;
    } while (ppBVar7 != ppBVar1);
  }
  return (BaseHandle)-1;
}

Assistant:

BasePropHandleT<T> handle(const T&, const std::string& _name) const
  {
    Properties::const_iterator p_it = properties_.begin();
    for (int idx=0; p_it != properties_.end(); ++p_it, ++idx)
    {
      if (*p_it != NULL &&
         (*p_it)->name() == _name  //skip deleted properties
// Skip type check
#ifndef OM_FORCE_STATIC_CAST
          && dynamic_cast<PropertyT<T>*>(properties_[idx]) != NULL //check type
#endif
         )
      {
        return BasePropHandleT<T>(idx);
      }
    }
    return BasePropHandleT<T>();
  }